

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
LINSimulationDataGenerator::CreateSerialByte(LINSimulationDataGenerator *this,U8 byte)

{
  BitState BVar1;
  LINSimulationDataGenerator *this_00;
  int iVar2;
  bool bVar3;
  U8 byte_local;
  
  this_00 = (LINSimulationDataGenerator *)&this->mChecksum;
  LINChecksum::add((LINChecksum *)this_00,byte);
  SwapEnds(this_00,&byte_local);
  BVar1 = (int)this + 0x10;
  SimulationChannelDescriptor::TransitionIfNeeded(BVar1);
  SimulationChannelDescriptor::Advance(BVar1);
  SimulationChannelDescriptor::Transition();
  SimulationChannelDescriptor::Advance(BVar1);
  iVar2 = 8;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    SimulationChannelDescriptor::TransitionIfNeeded(BVar1);
    SimulationChannelDescriptor::Advance(BVar1);
  }
  SimulationChannelDescriptor::TransitionIfNeeded(BVar1);
  SimulationChannelDescriptor::Advance(BVar1);
  return;
}

Assistant:

void LINSimulationDataGenerator::CreateSerialByte( U8 byte )
{
    U32 samples_per_bit = mSimulationSampleRateHz / mSettings->mBitRate;

    mChecksum.add( byte );
    SwapEnds( byte );

    // inter-byte space.....
    mSerialSimulationData.TransitionIfNeeded( BIT_HIGH );
    mSerialSimulationData.Advance( samples_per_bit * 2 );

    // start bit...
    mSerialSimulationData.Transition();               // low-going edge for start bit
    mSerialSimulationData.Advance( samples_per_bit ); // add start bit time

    U8 mask = 0x1 << 7;
    for( U32 i = 0; i < 8; i++ )
    {
        if( ( byte & mask ) != 0 )
            mSerialSimulationData.TransitionIfNeeded( BIT_HIGH );
        else
            mSerialSimulationData.TransitionIfNeeded( BIT_LOW );

        mSerialSimulationData.Advance( samples_per_bit );
        mask = mask >> 1;
    }

    // stop bit...
    mSerialSimulationData.TransitionIfNeeded( BIT_HIGH );
    mSerialSimulationData.Advance( samples_per_bit * 2 );
}